

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O3

int __thiscall Nova::Parse_Args::Find_Match(Parse_Args *this,string *str)

{
  pointer pAVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  long lVar3;
  size_type *psVar4;
  long lVar5;
  
  pAVar1 = (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->arg_data_list).
                super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar3 != 0) {
    lVar5 = (lVar3 >> 3) * 0x6f96f96f96f96f97;
    __s2 = (str->_M_dataplus)._M_p;
    __n = str->_M_string_length;
    psVar4 = &(pAVar1->str)._M_string_length;
    lVar3 = 0;
    do {
      if ((*psVar4 == __n) &&
         ((__n == 0 ||
          (iVar2 = bcmp((((string *)(psVar4 + -1))->_M_dataplus)._M_p,__s2,__n), iVar2 == 0)))) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      psVar4 = psVar4 + 0x27;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar3);
  }
  return -1;
}

Assistant:

int Parse_Args::
Find_Match(const std::string& str) const
{
    for(int i=0;i<arg_data_list.size();i++) if(arg_data_list[i].str==str) return i;
    return -1;
}